

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int MemHashConfigure(unqlite_kv_engine *pKvEngine,int iOp,__va_list_tag *ap)

{
  uint uVar1;
  long *local_70;
  long *local_58;
  ProcCmp xCmp;
  ProcHash xHash;
  int rc;
  mem_hash_kv_engine *pEngine;
  __va_list_tag *ap_local;
  int iOp_local;
  unqlite_kv_engine *pKvEngine_local;
  
  xHash._4_4_ = 0;
  if (iOp == 1) {
    if (*(int *)&pKvEngine[0x1a].pIo == 0) {
      uVar1 = ap->gp_offset;
      if (uVar1 < 0x29) {
        local_58 = (long *)((long)(int)uVar1 + (long)ap->reg_save_area);
        ap->gp_offset = uVar1 + 8;
      }
      else {
        local_58 = (long *)ap->overflow_arg_area;
        ap->overflow_arg_area = local_58 + 1;
      }
      if ((unqlite_kv_io *)*local_58 != (unqlite_kv_io *)0x0) {
        pKvEngine[0x18].pIo = (unqlite_kv_io *)*local_58;
      }
    }
    else {
      xHash._4_4_ = -4;
    }
  }
  else if (iOp == 2) {
    uVar1 = ap->gp_offset;
    if (uVar1 < 0x29) {
      local_70 = (long *)((long)(int)uVar1 + (long)ap->reg_save_area);
      ap->gp_offset = uVar1 + 8;
    }
    else {
      local_70 = (long *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_70 + 1;
    }
    if ((unqlite_kv_io *)*local_70 != (unqlite_kv_io *)0x0) {
      pKvEngine[0x19].pIo = (unqlite_kv_io *)*local_70;
    }
  }
  else {
    xHash._4_4_ = -0xd;
  }
  return xHash._4_4_;
}

Assistant:

static int MemHashConfigure(unqlite_kv_engine *pKvEngine,int iOp,va_list ap)
{
	mem_hash_kv_engine *pEngine = (mem_hash_kv_engine *)pKvEngine;
	int rc = UNQLITE_OK;
	switch(iOp){
	case UNQLITE_KV_CONFIG_HASH_FUNC:{
		/* Use a default hash function */
		if( pEngine->nRecord > 0 ){
			rc = UNQLITE_LOCKED;
		}else{
			ProcHash xHash = va_arg(ap,ProcHash);
			if( xHash ){
				pEngine->xHash = xHash;
			}
		}
		break;
									 }
	case UNQLITE_KV_CONFIG_CMP_FUNC: {
		/* Default comparison function */
		ProcCmp xCmp = va_arg(ap,ProcCmp);
		if( xCmp ){
			pEngine->xCmp = xCmp;
		}
		break;
									 }
	default:
		/* Unknown configuration option */
		rc = UNQLITE_UNKNOWN;
	}
	return rc;
}